

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio_test.h
# Opt level: O0

void pair(native_type *fds)

{
  int iVar1;
  ostream *poVar2;
  int *in_RDI;
  socklen_t len;
  int yes;
  native_type lst;
  sockaddr addr;
  sockaddr_in inaddr;
  socklen_t local_34 [3];
  sockaddr local_28;
  sockaddr local_18;
  int *local_8;
  
  local_8 = in_RDI;
  local_34[2] = socket(2,1,6);
  if ((int)local_34[2] < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar2 = std::operator<<(poVar2,"int(lst) >= 0");
    poVar2 = std::operator<<(poVar2," at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x33);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    return_code = 1;
  }
  memset(&local_18,0,0x10);
  memset(&local_28,0,0x10);
  local_18.sa_family = 2;
  local_18.sa_data._2_4_ = htonl(0x7f000001);
  local_18.sa_data[0] = '\0';
  local_18.sa_data[1] = '\0';
  local_34[1] = 1;
  iVar1 = setsockopt(local_34[2],1,2,local_34 + 1,4);
  if (iVar1 < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar2 = std::operator<<(poVar2,"int(setsockopt(lst,1,2,(char*)&yes,sizeof(yes))) >= 0");
    poVar2 = std::operator<<(poVar2," at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x3a);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    return_code = 1;
  }
  iVar1 = bind(local_34[2],&local_18,0x10);
  if (iVar1 < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar2 = std::operator<<(poVar2,"int(bind(lst,(struct sockaddr *)&inaddr,sizeof(inaddr))) >= 0")
    ;
    poVar2 = std::operator<<(poVar2," at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x3b);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    return_code = 1;
  }
  listen(local_34[2],1);
  local_34[0] = 0x10;
  iVar1 = getsockname(local_34[2],&local_28,local_34);
  if (iVar1 < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar2 = std::operator<<(poVar2,"int(getsockname(lst, &addr,&len)) >= 0");
    poVar2 = std::operator<<(poVar2," at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x43);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    return_code = 1;
  }
  iVar1 = socket(2,1,0);
  *local_8 = iVar1;
  if (*local_8 < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar2 = std::operator<<(poVar2,"int(fds[0]) >= 0");
    poVar2 = std::operator<<(poVar2," at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x45);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    return_code = 1;
  }
  iVar1 = connect(*local_8,&local_28,local_34[0]);
  if (iVar1 < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar2 = std::operator<<(poVar2,"int(connect(fds[0],&addr,len)) >= 0");
    poVar2 = std::operator<<(poVar2," at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x46);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    return_code = 1;
  }
  iVar1 = accept(local_34[2],(sockaddr *)0x0,(socklen_t *)0x0);
  local_8[1] = iVar1;
  if (local_8[1] < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar2 = std::operator<<(poVar2,"int(fds[1]) >= 0");
    poVar2 = std::operator<<(poVar2," at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x48);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    return_code = 1;
  }
  close(local_34[2]);
  return;
}

Assistant:

inline void pair(booster::aio::native_type fds[2])
{
	using namespace booster::aio;
	struct sockaddr_in inaddr;
	struct sockaddr addr;
	native_type lst=::socket(AF_INET, SOCK_STREAM,IPPROTO_TCP);
	check(lst);
	memset(&inaddr, 0, sizeof(inaddr));
	memset(&addr, 0, sizeof(addr));
	inaddr.sin_family = AF_INET;
	inaddr.sin_addr.s_addr = htonl(INADDR_LOOPBACK);
	inaddr.sin_port = 0;
	int yes=1;
	check(setsockopt(lst,SOL_SOCKET,SO_REUSEADDR,(char*)&yes,sizeof(yes)));
	check(bind(lst,(struct sockaddr *)&inaddr,sizeof(inaddr)));
	listen(lst,1);
#ifdef BOOSTER_WIN32
	int
#else
	socklen_t 
#endif
	len=sizeof(inaddr);
	check(getsockname(lst, &addr,&len));
	fds[0]=::socket(AF_INET, SOCK_STREAM,0);
	check(fds[0]);
	check(connect(fds[0],&addr,len));
	fds[1]=accept(lst,0,0);
	check(fds[1]);
	closefd(lst);
}